

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_unchange_all.c
# Opt level: O0

int zip_unchange_all(zip_t *za)

{
  _Bool _Var1;
  uint uVar2;
  ulong local_28;
  zip_uint64_t i;
  int ret;
  zip_t *za_local;
  
  _Var1 = _zip_hash_revert(za->names,&za->error);
  if (_Var1) {
    i._4_4_ = 0;
    for (local_28 = 0; local_28 < za->nentry; local_28 = local_28 + 1) {
      uVar2 = _zip_unchange(za,local_28,1);
      i._4_4_ = uVar2 | i._4_4_;
    }
    uVar2 = zip_unchange_archive(za);
    za_local._4_4_ = uVar2 | i._4_4_;
  }
  else {
    za_local._4_4_ = 0xffffffff;
  }
  return za_local._4_4_;
}

Assistant:

ZIP_EXTERN int
zip_unchange_all(zip_t *za) {
    int ret;
    zip_uint64_t i;

    if (!_zip_hash_revert(za->names, &za->error)) {
	return -1;
    }

    ret = 0;
    for (i = 0; i < za->nentry; i++)
	ret |= _zip_unchange(za, i, 1);

    ret |= zip_unchange_archive(za);

    return ret;
}